

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O1

float __thiscall
quantileloss::getUpdate
          (quantileloss *this,float prediction,float label,float update_scale,float pred_per_update)

{
  float fVar1;
  uint uVar2;
  float fVar3;
  
  fVar3 = label - prediction;
  if ((fVar3 == 0.0) && (!NAN(fVar3))) {
    return 0.0;
  }
  fVar1 = this->tau;
  if (0.0 < fVar3) {
    uVar2 = -(uint)(update_scale * pred_per_update * fVar1 < fVar3);
    return (float)(~uVar2 & (uint)(fVar3 / pred_per_update) | (uint)(update_scale * fVar1) & uVar2);
  }
  uVar2 = -(uint)(fVar3 < update_scale * pred_per_update * -(1.0 - fVar1));
  return (float)(~uVar2 & (uint)(fVar3 / pred_per_update) |
                (uint)((fVar1 + -1.0) * update_scale) & uVar2);
}

Assistant:

float getUpdate(float prediction, float label, float update_scale, float pred_per_update)
  {
    float err = label - prediction;
    if (err == 0)
      return 0;
    float normal = update_scale * pred_per_update;  // base update size
    if (err > 0)
    {
      normal = tau * normal;
      return (normal < err ? tau * update_scale : err / pred_per_update);
    }
    else
    {
      normal = -(1 - tau) * normal;
      return (normal > err ? (tau - 1) * update_scale : err / pred_per_update);
    }
  }